

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_encoding.cc
# Opt level: O2

bool draco::EncodeRawSymbolsInternal<draco::RAnsSymbolEncoder<2>>
               (uint32_t *symbols,int num_values,uint32_t max_entry_value,
               EncoderBuffer *target_buffer)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> frequencies;
  RAnsSymbolEncoder<2> encoder;
  allocator_type local_81;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  RAnsSymbolEncoder<2> local_68;
  
  uVar3 = (ulong)(uint)num_values;
  local_68.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,
             (ulong)(max_entry_value + 1),(value_type_conflict8 *)&local_68,&local_81);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < num_values) {
    uVar2 = (ulong)(uint)num_values;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    local_80._M_impl.super__Vector_impl_data._M_start[symbols[uVar1]] =
         local_80._M_impl.super__Vector_impl_data._M_start[symbols[uVar1]] + 1;
  }
  local_68.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_68.probability_table_.super__Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_68.num_expected_bits_ = 0;
  local_68.ans_.ans_.buf = (uint8_t *)0x0;
  local_68.ans_.ans_.buf_offset = 0;
  local_68.ans_.ans_.state = 0;
  local_68.buffer_offset_ = 0;
  RAnsSymbolEncoder<2>::Create
            (&local_68,local_80._M_impl.super__Vector_impl_data._M_start,
             (int)((ulong)((long)local_80._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_80._M_impl.super__Vector_impl_data._M_start) >> 3),
             target_buffer);
  RAnsSymbolEncoder<2>::StartEncoding(&local_68,target_buffer);
  for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    RAnsSymbolEncoder<2>::EncodeSymbol(&local_68,symbols[uVar3 - 1]);
  }
  RAnsSymbolEncoder<2>::EndEncoding(&local_68,target_buffer);
  std::_Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_>::~_Vector_base
            ((_Vector_base<draco::rans_sym,_std::allocator<draco::rans_sym>_> *)&local_68);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_80);
  return true;
}

Assistant:

bool EncodeRawSymbolsInternal(const uint32_t *symbols, int num_values,
                              uint32_t max_entry_value,
                              EncoderBuffer *target_buffer) {
  // Count the frequency of each entry value.
  std::vector<uint64_t> frequencies(max_entry_value + 1, 0);
  for (int i = 0; i < num_values; ++i) {
    ++frequencies[symbols[i]];
  }

  SymbolEncoderT encoder;
  encoder.Create(frequencies.data(), static_cast<int>(frequencies.size()),
                 target_buffer);
  encoder.StartEncoding(target_buffer);
  // Encode all values.
  if (SymbolEncoderT::needs_reverse_encoding()) {
    for (int i = num_values - 1; i >= 0; --i) {
      encoder.EncodeSymbol(symbols[i]);
    }
  } else {
    for (int i = 0; i < num_values; ++i) {
      encoder.EncodeSymbol(symbols[i]);
    }
  }
  encoder.EndEncoding(target_buffer);
  return true;
}